

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O2

void test_bson_alloc(void)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  byte *pbVar4;
  void *__s1;
  char *pcVar5;
  undefined8 uStack_10;
  
  puVar3 = (uint *)bson_new();
  if (puVar3[1] != 5) {
    pcVar5 = "FAIL\n\nAssert Failure: (line#%d)b->len == 5\n";
    uStack_10 = 0x52;
    goto LAB_0010a3f5;
  }
  uVar1 = *puVar3;
  if ((uVar1 & 1) == 0) {
    pcVar5 = "(b->flags & BSON_FLAG_INLINE)";
    uStack_10 = 0x53;
  }
  else if ((uVar1 & 8) == 0) {
    if ((uVar1 & 2) == 0) {
      if ((uVar1 & 0x20) == 0) {
        bson_destroy(puVar3);
        pbVar4 = (byte *)bson_sized_new(0x2c);
        if (*(int *)(pbVar4 + 4) != 5) {
          pcVar5 = "FAIL\n\nAssert Failure: (line#%d)b->len == 5\n";
          uStack_10 = 0x5d;
LAB_0010a3f5:
          fprintf(_stderr,pcVar5,uStack_10);
          abort();
        }
        if ((*pbVar4 & 1) == 0) {
          pcVar5 = "(b->flags & BSON_FLAG_INLINE)";
          uStack_10 = 0x5e;
        }
        else {
          bson_destroy(pbVar4);
          pbVar4 = (byte *)bson_sized_new(0x79);
          if (*(int *)(pbVar4 + 4) != 5) {
            pcVar5 = "FAIL\n\nAssert Failure: (line#%d)b->len == 5\n";
            uStack_10 = 0x65;
            goto LAB_0010a3f5;
          }
          if ((*pbVar4 & 1) == 0) {
            bson_destroy(pbVar4);
            pbVar4 = (byte *)bson_sized_new(0x81);
            if (*(int *)(pbVar4 + 4) != 5) {
              pcVar5 = "FAIL\n\nAssert Failure: (line#%d)b->len == 5\n";
              uStack_10 = 0x6d;
              goto LAB_0010a3f5;
            }
            if ((*pbVar4 & 1) == 0) {
              bson_destroy(pbVar4);
              pbVar4 = (byte *)bson_new_from_data("\x05",5);
              if (*(int *)(pbVar4 + 4) != 5) {
                pcVar5 = "FAIL\n\nAssert Failure: (line#%d)b->len == sizeof empty_bson\n";
                uStack_10 = 0x72;
                goto LAB_0010a3f5;
              }
              if ((*pbVar4 & 1) == 0) {
                pcVar5 = "(b->flags & BSON_FLAG_INLINE)";
                uStack_10 = 0x73;
              }
              else {
                __s1 = (void *)bson_get_data(pbVar4);
                iVar2 = bcmp(__s1,"\x05",5);
                if (iVar2 == 0) {
                  bson_destroy(pbVar4);
                  return;
                }
                pcVar5 = "!memcmp (bson_get_data (b), empty_bson, sizeof empty_bson)";
                uStack_10 = 0x74;
              }
            }
            else {
              pcVar5 = "!(b->flags & BSON_FLAG_INLINE)";
              uStack_10 = 0x6e;
            }
          }
          else {
            pcVar5 = "!(b->flags & BSON_FLAG_INLINE)";
            uStack_10 = 0x66;
          }
        }
      }
      else {
        pcVar5 = "!(b->flags & BSON_FLAG_NO_FREE)";
        uStack_10 = 0x56;
      }
    }
    else {
      pcVar5 = "!(b->flags & BSON_FLAG_STATIC)";
      uStack_10 = 0x55;
    }
  }
  else {
    pcVar5 = "!(b->flags & BSON_FLAG_CHILD)";
    uStack_10 = 0x54;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
          uStack_10,"test_bson_alloc",pcVar5);
  abort();
}

Assistant:

static void
test_bson_alloc (void)
{
   static const uint8_t empty_bson[] = {5, 0, 0, 0, 0};
   bson_t *b;

   b = bson_new ();
   BSON_ASSERT_CMPINT (b->len, ==, 5);
   BSON_ASSERT ((b->flags & BSON_FLAG_INLINE));
   BSON_ASSERT (!(b->flags & BSON_FLAG_CHILD));
   BSON_ASSERT (!(b->flags & BSON_FLAG_STATIC));
   BSON_ASSERT (!(b->flags & BSON_FLAG_NO_FREE));
   bson_destroy (b);

   /*
    * This checks that we fit in the inline buffer size.
    */
   b = bson_sized_new (44);
   BSON_ASSERT_CMPINT (b->len, ==, 5);
   BSON_ASSERT ((b->flags & BSON_FLAG_INLINE));
   bson_destroy (b);

   /*
    * Make sure we grow to next power of 2.
    */
   b = bson_sized_new (121);
   BSON_ASSERT_CMPINT (b->len, ==, 5);
   BSON_ASSERT (!(b->flags & BSON_FLAG_INLINE));
   bson_destroy (b);

   /*
    * Make sure we grow to next power of 2.
    */
   b = bson_sized_new (129);
   BSON_ASSERT_CMPINT (b->len, ==, 5);
   BSON_ASSERT (!(b->flags & BSON_FLAG_INLINE));
   bson_destroy (b);

   b = bson_new_from_data (empty_bson, sizeof empty_bson);
   BSON_ASSERT_CMPINT (b->len, ==, sizeof empty_bson);
   BSON_ASSERT ((b->flags & BSON_FLAG_INLINE));
   BSON_ASSERT (!memcmp (bson_get_data (b), empty_bson, sizeof empty_bson));
   bson_destroy (b);
}